

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_trunc_l_d_mipsel(CPUMIPSState_conflict4 *env,uint64_t fdt0)

{
  uint64_t uVar1;
  uintptr_t unaff_retaddr;
  
  uVar1 = float64_to_int64_round_to_zero_mipsel(fdt0,&(env->active_fpu).fp_status);
  if (((env->active_fpu).fp_status.float_exception_flags & 9) != 0) {
    uVar1 = 0x7fffffffffffffff;
  }
  update_fcr31(env,unaff_retaddr);
  return uVar1;
}

Assistant:

uint64_t helper_float_trunc_l_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint64_t dt2;

    dt2 = float64_to_int64_round_to_zero(fdt0,
                                         &env->active_fpu.fp_status);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
        & (float_flag_invalid | float_flag_overflow)) {
        dt2 = FP_TO_INT64_OVERFLOW;
    }
    update_fcr31(env, GETPC());
    return dt2;
}